

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsInt __thiscall
HighsOrbitopeMatrix::getBranchingColumn
          (HighsOrbitopeMatrix *this,vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt col)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  pointer pcVar6;
  uint *puVar7;
  long lVar8;
  byte bVar9;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_35;
  uint local_34;
  u64 local_30;
  u64 local_28;
  u64 local_20;
  
  local_34 = col;
  bVar5 = HighsHashTable<int,_int>::findPosition
                    (&this->columnToRow,(KeyType_conflict *)&local_34,&local_35,&local_20,&local_28,
                     &local_30);
  if (bVar5) {
    iVar3 = *(int *)((long)((this->columnToRow).entries._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                            .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>.
                            _M_head_impl + local_30) + 4);
    pcVar6 = (this->rowIsSetPacking).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pcVar6[iVar3] != '\0') {
      lVar8 = (long)this->rowLength;
      if (lVar8 < 1) {
        bVar5 = true;
      }
      else {
        puVar7 = (uint *)((this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + iVar3);
        do {
          uVar4 = *puVar7;
          if (uVar4 == local_34) {
            bVar9 = 2;
            bVar5 = false;
          }
          else {
            dVar1 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar4];
            dVar2 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar4];
            bVar5 = dVar1 == dVar2;
            bVar9 = -(dVar1 != dVar2) & 1;
            pcVar6 = (pointer)((ulong)pcVar6 & 0xffffffff);
            if (dVar1 != dVar2) {
              pcVar6 = (pointer)(ulong)uVar4;
            }
            if (NAN(dVar1) || NAN(dVar2)) {
              pcVar6 = (pointer)(ulong)uVar4;
            }
          }
          if (!bVar5) goto LAB_002feb27;
          puVar7 = puVar7 + this->numRows;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        bVar9 = 2;
LAB_002feb27:
        bVar5 = bVar9 == 2;
      }
      if (!bVar5) {
        return (HighsInt)pcVar6;
      }
    }
  }
  return local_34;
}

Assistant:

HighsInt HighsOrbitopeMatrix::getBranchingColumn(
    const std::vector<double>& colLower, const std::vector<double>& colUpper,
    HighsInt col) const {
  const HighsInt* i = columnToRow.find(col);
  if (i && rowIsSetPacking[*i]) {
    for (HighsInt j = 0; j < rowLength; ++j) {
      HighsInt branchCol = entry(*i, j);
      if (branchCol == col) break;
      if (colLower[branchCol] != colUpper[branchCol]) return branchCol;
    }
  }

  return col;
}